

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void Cmd_dumpgeometry(FCommandLine *argv,APlayerPawn *who,int key)

{
  subsector_t *psVar1;
  sector_t *psVar2;
  seg_t *psVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  subsector_t *sub2;
  seg_t *seg;
  DWORD k;
  subsector_t *sub;
  int j;
  sector_t *sector;
  int i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  for (sector._0_4_ = 0; psVar2 = sectors, (int)(uint)sector < numsectors;
      sector._0_4_ = (uint)sector + 1) {
    Printf(5,"Sector %d\n",(ulong)(uint)sector);
    for (sub._4_4_ = 0; sub._4_4_ < psVar2[(int)(uint)sector].subsectorcount;
        sub._4_4_ = sub._4_4_ + 1) {
      psVar1 = psVar2[(int)(uint)sector].subsectors[sub._4_4_];
      pcVar4 = "";
      if ((psVar1->hacked & 1U) != 0) {
        pcVar4 = "hacked";
      }
      Printf(5,"    Subsector %d - real sector = %d - %s\n",
             ((long)psVar1 - (long)subsectors) / 0x60 & 0xffffffff,
             (ulong)(uint)psVar1->sector->sectornum,pcVar4);
      for (seg._4_4_ = 0; seg._4_4_ < psVar1->numlines; seg._4_4_ = seg._4_4_ + 1) {
        psVar3 = psVar1->firstline + seg._4_4_;
        if (psVar3->linedef == (line_t *)0x0) {
          dVar5 = vertex_t::fX(psVar3->v1);
          dVar6 = vertex_t::fY(psVar3->v1);
          dVar7 = vertex_t::fX(psVar3->v2);
          dVar8 = vertex_t::fY(psVar3->v2);
          Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg",dVar5,dVar6,dVar7,
                 SUB84(dVar8,0),((long)psVar3 - (long)segs) / 0x48 & 0xffffffff);
        }
        else {
          dVar5 = vertex_t::fX(psVar3->v1);
          dVar6 = vertex_t::fY(psVar3->v1);
          dVar7 = vertex_t::fX(psVar3->v2);
          dVar8 = vertex_t::fY(psVar3->v2);
          Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d",dVar5,dVar6,
                 dVar7,SUB84(dVar8,0),((long)psVar3 - (long)segs) / 0x48 & 0xffffffff,
                 ((long)psVar3->linedef - (long)lines) / 0x98 & 0xffffffff,
                 (ulong)(psVar3->sidedef != psVar3->linedef->sidedef[0]));
        }
        if (psVar3->PartnerSeg == (seg_t *)0x0) {
          if (psVar3->backsector != (sector_t *)0x0) {
            Printf(5,", back sector = %d (no partnerseg)",(ulong)(uint)psVar3->backsector->sectornum
                  );
          }
        }
        else {
          Printf(5,", back sector = %d, real back sector = %d",
                 (ulong)(uint)psVar3->PartnerSeg->Subsector->render_sector->sectornum,
                 (ulong)(uint)psVar3->PartnerSeg->frontsector->sectornum);
        }
        Printf(5,"\n");
      }
    }
  }
  return;
}

Assistant:

CCMD(dumpgeometry)
{
	for(int i=0;i<numsectors;i++)
	{
		sector_t * sector = &sectors[i];

		Printf(PRINT_LOG, "Sector %d\n",i);
		for(int j=0;j<sector->subsectorcount;j++)
		{
			subsector_t * sub = sector->subsectors[j];

			Printf(PRINT_LOG, "    Subsector %d - real sector = %d - %s\n", int(sub-subsectors), sub->sector->sectornum, sub->hacked&1? "hacked":"");
			for(DWORD k=0;k<sub->numlines;k++)
			{
				seg_t * seg = sub->firstline + k;
				if (seg->linedef)
				{
				Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d", 
					seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
					int(seg-segs), int(seg->linedef-lines), seg->sidedef != seg->linedef->sidedef[0]);
				}
				else
				{
					Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg", 
						seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
						int(seg-segs));
				}
				if (seg->PartnerSeg) 
				{
					subsector_t * sub2 = seg->PartnerSeg->Subsector;
					Printf(PRINT_LOG, ", back sector = %d, real back sector = %d", sub2->render_sector->sectornum, seg->PartnerSeg->frontsector->sectornum);
				}
				else if (seg->backsector)
				{
					Printf(PRINT_LOG, ", back sector = %d (no partnerseg)", seg->backsector->sectornum);
				}

				Printf(PRINT_LOG, "\n");
			}
		}
	}
}